

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxweightst.hpp
# Opt level: O1

void __thiscall
soplex::
SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::generate(SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *base)

{
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  undefined8 uVar1;
  double dVar2;
  byte bVar3;
  pointer pnVar4;
  pointer pnVar5;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar6;
  int *piVar7;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar8;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pAVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_02;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  int *piVar19;
  pointer *ppnVar20;
  uint *puVar21;
  undefined4 *puVar22;
  DataKey *pDVar23;
  undefined4 *puVar24;
  cpp_dec_float<200U,_int,_void> *pcVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  uint uVar29;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pAVar30;
  bool bVar31;
  byte bVar32;
  Real a;
  DataArray<soplex::SPxId> pref;
  SPxId tmpId;
  DataArray<int> row;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  feastol;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  Desc desc;
  DataArray<int> col;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  ulong local_3e0;
  uint local_3d4;
  SPxId *local_3c0;
  undefined8 local_3b8;
  int local_3ac;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_3a8;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_3a0;
  DataArray<int> *local_398;
  DataKey local_390;
  undefined1 local_388 [8];
  int *piStack_380;
  uint local_378 [23];
  undefined3 uStack_31b;
  int iStack_318;
  bool bStack_314;
  undefined8 local_310;
  cpp_dec_float<200U,_int,_void> local_308;
  ulong local_280;
  cpp_dec_float<200U,_int,_void> local_278;
  Desc local_1f0;
  undefined1 local_1b0 [8];
  int *local_1a8;
  uint local_1a0 [24];
  int local_140;
  bool local_13c;
  fpclass_type local_138;
  int32_t iStack_134;
  cpp_dec_float<200U,_int,_void> local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar32 = 0;
  local_390.info = 0;
  local_390.idx = -1;
  local_398 = &this->forbidden;
  DataArray<int>::reSize(local_398,(base->thecovectors->set).thenum);
  this_00 = &this->rowWeight;
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::resize(&this_00->data,
           (long)(base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum);
  this_01 = &this->colWeight;
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::resize(&this_01->data,
           (long)(base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum);
  DataArray<bool>::reSize
            (&this->rowRight,
             (base->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum);
  DataArray<bool>::reSize
            (&this->colUp,
             (base->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum);
  pAVar30 = this_01;
  pAVar9 = this_00;
  if (base->theRep == COLUMN) {
    pAVar30 = this_00;
    pAVar9 = this_01;
  }
  this->weight = pAVar9;
  this->coWeight = pAVar30;
  local_3a8 = this_00;
  local_3a0 = this_01;
  (*(this->
    super_SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SPxStarter[8])(this,base);
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::Desc::Desc(&local_1f0,base);
  iVar16 = (base->
           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum +
           (base->
           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
  local_3c0 = (SPxId *)0x0;
  local_3b8 = 0x3ff3333333333333;
  iVar17 = iVar16;
  if (iVar16 < 1) {
    iVar17 = 0;
    iVar16 = 1;
  }
  spx_alloc<soplex::SPxId*>(&local_3c0,iVar16);
  local_388._4_4_ =
       (base->
       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .
       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .set.thenum;
  piStack_380 = (int *)0x0;
  local_378[0] = 0x33333333;
  local_378[1] = 0x3ff33333;
  local_388._0_4_ = local_388._4_4_;
  if ((int)local_388._4_4_ < 1) {
    local_388._4_4_ = 1;
    local_388._0_4_ = 0;
  }
  spx_alloc<int*>(&piStack_380,local_388._4_4_);
  uVar29 = (base->
           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
  local_1a8 = (int *)0x0;
  local_1a0[0] = 0x33333333;
  local_1a0[1] = 0x3ff33333;
  local_1b0._0_4_ = 0;
  if (0 < (int)uVar29) {
    local_1b0._0_4_ = uVar29;
  }
  local_1b0._4_4_ = 1;
  if (0 < (int)uVar29) {
    local_1b0._4_4_ = local_1b0._0_4_;
  }
  spx_alloc<int*>(&local_1a8,local_1b0._4_4_);
  if (0 < (base->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    lVar13 = 0;
    do {
      piStack_380[lVar13] = (int)lVar13;
      lVar13 = lVar13 + 1;
    } while (lVar13 < (base->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  local_130.data._M_elems._0_8_ =
       (local_3a8->data).
       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  SPxQuicksort<int,soplex::Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>>
            (piStack_380,local_388._0_4_,
             (Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)&local_130,0,true);
  if (0 < (base->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    lVar13 = 0;
    do {
      local_1a8[lVar13] = (int)lVar13;
      lVar13 = lVar13 + 1;
    } while (lVar13 < (base->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  local_130.data._M_elems._0_8_ =
       (local_3a0->data).
       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  SPxQuicksort<int,soplex::Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>>
            (local_1a8,local_1b0._0_4_,
             (Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)&local_130,0,true);
  if (0 < iVar17) {
    uVar15 = 0;
    iVar16 = 0;
    uVar28 = 0;
    do {
      local_3d4 = (uint)uVar28;
      uVar28 = (ulong)(int)local_3d4;
      pnVar4 = (local_3a8->data).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar13 = (long)iVar16;
      iVar11 = (int)uVar15;
      if (pnVar4[piStack_380[uVar28]].m_backend.fpclass == cpp_dec_float_NaN) {
LAB_0059e9cb:
        local_278.data._M_elems._0_8_ =
             (base->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thekey[local_1a8[lVar13]];
        SPxColId::SPxColId((SPxColId *)&local_308,(DataKey *)&local_278);
        iVar16 = iVar16 + 1;
        local_3c0[iVar11].super_DataKey.info = local_308.data._M_elems[0];
        local_3c0[iVar11].super_DataKey.idx = local_308.data._M_elems[1];
        local_3c0[iVar11].super_DataKey.info = 1;
        uVar29 = iVar11 + 1;
        uVar15 = (ulong)uVar29;
        if ((iVar16 < (base->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum) || (iVar17 <= (int)uVar29)) {
LAB_0059eb4b:
          uVar28 = (ulong)local_3d4;
        }
        else {
          uVar26 = (long)(int)uVar29;
          do {
            local_278.data._M_elems._0_8_ =
                 (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thekey[piStack_380[uVar28]];
            SPxRowId::SPxRowId((SPxRowId *)&local_308,(DataKey *)&local_278);
            uVar28 = uVar28 + 1;
            uVar15 = uVar26 + 1;
            local_3c0[uVar26].super_DataKey.info = local_308.data._M_elems[0];
            local_3c0[uVar26].super_DataKey.idx = local_308.data._M_elems[1];
            local_3c0[uVar26].super_DataKey.info = -1;
            uVar26 = uVar15;
          } while ((long)uVar15 < (long)iVar17);
          uVar28 = uVar28 & 0xffffffff;
        }
      }
      else {
        pnVar5 = (local_3a0->data).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((pnVar5[local_1a8[lVar13]].m_backend.fpclass == cpp_dec_float_NaN) ||
           (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&pnVar4[piStack_380[uVar28]].m_backend,
                                &pnVar5[local_1a8[lVar13]].m_backend), -1 < iVar10))
        goto LAB_0059e9cb;
        local_278.data._M_elems._0_8_ =
             (base->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thekey[piStack_380[uVar28]];
        SPxRowId::SPxRowId((SPxRowId *)&local_308,(DataKey *)&local_278);
        local_3d4 = local_3d4 + 1;
        uVar28 = (ulong)local_3d4;
        local_3c0[iVar11].super_DataKey.info = local_308.data._M_elems[0];
        local_3c0[iVar11].super_DataKey.idx = local_308.data._M_elems[1];
        local_3c0[iVar11].super_DataKey.info = -1;
        uVar29 = iVar11 + 1;
        uVar15 = (ulong)uVar29;
        if (((base->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum <= (int)local_3d4) && ((int)uVar29 < iVar17)) {
          uVar28 = (long)(int)uVar29;
          do {
            local_278.data._M_elems._0_8_ =
                 (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thekey[local_1a8[lVar13]];
            SPxColId::SPxColId((SPxColId *)&local_308,(DataKey *)&local_278);
            lVar13 = lVar13 + 1;
            uVar15 = uVar28 + 1;
            local_3c0[uVar28].super_DataKey.info = local_308.data._M_elems[0];
            local_3c0[uVar28].super_DataKey.idx = local_308.data._M_elems[1];
            local_3c0[uVar28].super_DataKey.info = 1;
            uVar28 = uVar15;
          } while ((long)uVar15 < (long)iVar17);
          iVar16 = (int)lVar13;
          goto LAB_0059eb4b;
        }
      }
    } while ((int)uVar15 < iVar17);
  }
  if (local_1a8 != (int *)0x0) {
    free(local_1a8);
    local_1a8 = (int *)0x0;
  }
  if (piStack_380 != (int *)0x0) {
    free(piStack_380);
    piStack_380 = (int *)0x0;
  }
  pSVar6 = base->thecovectors;
  uVar29 = (pSVar6->set).thenum;
  local_3e0 = (ulong)uVar29;
  if (0 < (int)uVar29) {
    piVar7 = (this->forbidden).data;
    lVar13 = 0;
    do {
      piVar7[lVar13] = 0;
      lVar13 = lVar13 + 1;
      local_3e0 = (ulong)(pSVar6->set).thenum;
    } while (lVar13 < (long)local_3e0);
  }
  bVar31 = base->theRep == COLUMN;
  uVar15 = (ulong)(iVar17 - 1);
  if (bVar31) {
    uVar15 = 0;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            ((cpp_dec_float<200U,_int,_void> *)local_1b0,0,(type *)0x0);
  if ((-1 < (int)uVar15) && ((int)uVar15 < iVar17)) {
    iVar16 = (uint)bVar31 * 2 + -1;
    local_3ac = iVar16;
    do {
      uVar29 = (uint)uVar15;
      local_390 = local_3c0[uVar15].super_DataKey;
      this_02 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::vector(base,(SPxId *)&local_390);
      if (this_02->memused == 1) {
        uVar12 = this_02->m_elem->idx;
        iVar11 = (this->forbidden).data[(int)uVar12];
        if (iVar11 < 2) {
          local_3e0 = (ulong)((int)local_3e0 + (uint)(iVar11 == 1));
        }
        else {
LAB_0059ef77:
          uVar12 = 0xffffffff;
        }
      }
      else {
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::maxAbs((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_388,this_02);
        pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)local_388;
        puVar21 = (uint *)local_1b0;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          *puVar21 = (pnVar18->m_backend).data._M_elems[0];
          pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar18 + ((ulong)bVar32 * -2 + 1) * 4);
          puVar21 = puVar21 + (ulong)bVar32 * -2 + 1;
        }
        local_140 = iStack_318;
        local_13c = bStack_314;
        local_138 = (fpclass_type)local_310;
        iStack_134 = local_310._4_4_;
        lVar13 = (long)this_02->memused;
        if (lVar13 < 1) goto LAB_0059ef77;
        local_280 = uVar15;
        local_3a0 = (Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)CONCAT44(local_3a0._4_4_,
                                (base->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .set.thenum);
        lVar27 = lVar13 + 1;
        lVar13 = lVar13 * 0x84 + -4;
        local_3a8 = (Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)CONCAT44(local_3a8._4_4_,0xffffffff);
        do {
          pNVar8 = this_02->m_elem;
          piVar7 = (int *)((long)(pNVar8->val).m_backend.data._M_elems + lVar13);
          piVar19 = piVar7 + -0x20;
          ppnVar20 = (pointer *)&local_130;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            *(int *)ppnVar20 = *piVar19;
            piVar19 = piVar19 + (ulong)bVar32 * -2 + 1;
            ppnVar20 = (pointer *)((long)ppnVar20 + ((ulong)bVar32 * -2 + 1) * 4);
          }
          iVar16 = *piVar7;
          if ((this->forbidden).data[iVar16] == 0) {
            iVar11 = *(int *)((long)(pNVar8->val).m_backend.data._M_elems + lVar13 + -0x10);
            bVar3 = *(byte *)((long)(pNVar8->val).m_backend.data._M_elems + lVar13 + -0xc);
            uVar1 = *(undefined8 *)((long)(pNVar8->val).m_backend.data._M_elems + lVar13 + -8);
            iVar10 = (base->thecovectors->set).theitem[(base->thecovectors->set).thekey[iVar16].idx]
                     .data.
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused;
            ppnVar20 = (pointer *)&local_130;
            pDVar23 = (DataKey *)&local_308;
            for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
              pDVar23->info = *(int *)ppnVar20;
              ppnVar20 = (pointer *)((long)ppnVar20 + (ulong)bVar32 * -8 + 4);
              pDVar23 = (DataKey *)&pDVar23[-(ulong)bVar32].idx;
            }
            local_308.neg = (bool)bVar3;
            if ((bVar3 != 0) &&
               ((fpclass_type)uVar1 != cpp_dec_float_finite || local_308.data._M_elems[0] != 0)) {
              local_308.neg = (bool)(bVar3 ^ 1);
            }
            local_308.exp = iVar11;
            local_308._120_8_ = uVar1;
            iVar11 = (*(this->
                       super_SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._vptr_SPxStarter[6])();
            dVar2 = *(double *)(*(long *)CONCAT44(extraout_var,iVar11) + 0x40);
            uVar15 = -(ulong)(dVar2 == 1.0);
            local_278.fpclass = cpp_dec_float_finite;
            local_278.prec_elem = 0x1c;
            local_278.data._M_elems[0] = 0;
            local_278.data._M_elems[1] = 0;
            local_278.data._M_elems[2] = 0;
            local_278.data._M_elems[3] = 0;
            local_278.data._M_elems[4] = 0;
            local_278.data._M_elems[5] = 0;
            local_278.data._M_elems[6] = 0;
            local_278.data._M_elems[7] = 0;
            local_278.data._M_elems[8] = 0;
            local_278.data._M_elems[9] = 0;
            local_278.data._M_elems[10] = 0;
            local_278.data._M_elems[0xb] = 0;
            local_278.data._M_elems[0xc] = 0;
            local_278.data._M_elems[0xd] = 0;
            local_278.data._M_elems[0xe] = 0;
            local_278.data._M_elems[0xf] = 0;
            local_278.data._M_elems[0x10] = 0;
            local_278.data._M_elems[0x11] = 0;
            local_278.data._M_elems[0x12] = 0;
            local_278.data._M_elems[0x13] = 0;
            local_278.data._M_elems[0x14] = 0;
            local_278.data._M_elems[0x15] = 0;
            local_278.data._M_elems[0x16] = 0;
            local_278.data._M_elems[0x17] = 0;
            local_278.data._M_elems[0x18] = 0;
            local_278.data._M_elems[0x19] = 0;
            local_278.data._M_elems._104_5_ = 0;
            local_278.data._M_elems[0x1b]._1_3_ = 0;
            local_278.exp = 0;
            local_278.neg = false;
            local_310._0_4_ = cpp_dec_float_finite;
            local_310._4_4_ = 0x1c;
            local_388._0_4_ = 0;
            local_388._4_4_ = 0;
            piStack_380 = (int *)0x0;
            local_378[0] = 0;
            local_378[1] = 0;
            local_378[2] = 0;
            local_378[3] = 0;
            local_378[4] = 0;
            local_378[5] = 0;
            local_378[6] = 0;
            local_378[7] = 0;
            local_378[8] = 0;
            local_378[9] = 0;
            local_378[10] = 0;
            local_378[0xb] = 0;
            local_378[0xc] = 0;
            local_378[0xd] = 0;
            local_378[0xe] = 0;
            local_378[0xf] = 0;
            local_378[0x10] = 0;
            local_378[0x11] = 0;
            local_378[0x12] = 0;
            local_378[0x13] = 0;
            local_378[0x14] = 0;
            local_378[0x15] = 0;
            stack0xfffffffffffffce0 = 0;
            uStack_31b = 0;
            iStack_318 = 0;
            bStack_314 = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_388,
                       (double)(~uVar15 & (ulong)(dVar2 * 0.001) | uVar15 & 0x3f50624dd2f1a9fc));
            puVar21 = (uint *)local_1b0;
            pcVar25 = &local_278;
            for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
              (pcVar25->data)._M_elems[0] = *puVar21;
              puVar21 = puVar21 + (ulong)bVar32 * -2 + 1;
              pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar32 * -8 + 4);
            }
            local_278.exp = local_140;
            local_278.neg = local_13c;
            local_278.fpclass = local_138;
            local_278.prec_elem = iStack_134;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      (&local_278,(cpp_dec_float<200U,_int,_void> *)local_388);
            if (((local_308.fpclass != cpp_dec_float_NaN) &&
                (local_278.fpclass != cpp_dec_float_NaN)) &&
               (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&local_308,&local_278), 0 < iVar11)) {
              iVar11 = (uint)local_3a8;
              if (iVar10 < (int)local_3a0) {
                iVar11 = iVar16;
              }
              local_3a8 = (Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)CONCAT44(local_3a8._4_4_,iVar11);
              iVar16 = (int)local_3a0;
              if (iVar10 < (int)local_3a0) {
                iVar16 = iVar10;
              }
              local_3a0 = (Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)CONCAT44(local_3a0._4_4_,iVar16);
            }
          }
          lVar27 = lVar27 + -1;
          lVar13 = lVar13 + -0x84;
        } while (1 < lVar27);
        uVar15 = local_280;
        iVar16 = local_3ac;
        uVar12 = (uint)local_3a8;
      }
      if ((int)uVar12 < 0) {
        bVar31 = true;
        if (base->theRep == COLUMN) {
          setPrimalStatus(this,&local_1f0,base,local_3c0 + uVar15);
        }
        else {
          setDualStatus<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_1f0,base,local_3c0 + uVar15);
        }
      }
      else {
        (this->forbidden).data[uVar12] = 2;
        if (base->theRep == COLUMN) {
          setDualStatus<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_1f0,base,local_3c0 + uVar15);
        }
        else {
          setPrimalStatus(this,&local_1f0,base,local_3c0 + uVar15);
        }
        lVar13 = (long)this_02->memused;
        if (0 < lVar13) {
          lVar27 = lVar13 + 1;
          lVar13 = lVar13 * 0x84;
          do {
            pNVar8 = this_02->m_elem;
            puVar22 = (undefined4 *)((long)pNVar8[-1].val.m_backend.data._M_elems + lVar13);
            puVar24 = (undefined4 *)local_388;
            for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
              *puVar24 = *puVar22;
              puVar22 = puVar22 + (ulong)bVar32 * -2 + 1;
              puVar24 = puVar24 + (ulong)bVar32 * -2 + 1;
            }
            iStack_318 = *(int *)((long)(pNVar8->val).m_backend.data._M_elems + lVar13 + -0x14);
            bStack_314 = *(bool *)((long)(pNVar8->val).m_backend.data._M_elems + lVar13 + -0x10);
            local_310 = *(undefined8 *)((long)(pNVar8->val).m_backend.data._M_elems + lVar13 + -0xc)
            ;
            iVar16 = *(int *)((long)(this_02->m_elem->val).m_backend.data._M_elems + lVar13 + -4);
            iVar11 = (*(this->
                       super_SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._vptr_SPxStarter[6])();
            a = Tolerances::floatingPointFeastol(*(Tolerances **)CONCAT44(extraout_var_00,iVar11));
            local_308.fpclass = cpp_dec_float_finite;
            local_308.prec_elem = 0x1c;
            local_308.data._M_elems[0] = 0;
            local_308.data._M_elems[1] = 0;
            local_308.data._M_elems[2] = 0;
            local_308.data._M_elems[3] = 0;
            local_308.data._M_elems[4] = 0;
            local_308.data._M_elems[5] = 0;
            local_308.data._M_elems[6] = 0;
            local_308.data._M_elems[7] = 0;
            local_308.data._M_elems[8] = 0;
            local_308.data._M_elems[9] = 0;
            local_308.data._M_elems[10] = 0;
            local_308.data._M_elems[0xb] = 0;
            local_308.data._M_elems[0xc] = 0;
            local_308.data._M_elems[0xd] = 0;
            local_308.data._M_elems[0xe] = 0;
            local_308.data._M_elems[0xf] = 0;
            local_308.data._M_elems[0x10] = 0;
            local_308.data._M_elems[0x11] = 0;
            local_308.data._M_elems[0x12] = 0;
            local_308.data._M_elems[0x13] = 0;
            local_308.data._M_elems[0x14] = 0;
            local_308.data._M_elems[0x15] = 0;
            local_308.data._M_elems[0x16] = 0;
            local_308.data._M_elems[0x17] = 0;
            local_308.data._M_elems[0x18] = 0;
            local_308.data._M_elems[0x19] = 0;
            local_308.data._M_elems._104_5_ = 0;
            local_308.data._M_elems[0x1b]._1_3_ = 0;
            local_308.exp = 0;
            local_308.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_308,a);
            if ((this->forbidden).data[iVar16] == 0) {
              local_278.fpclass = cpp_dec_float_finite;
              local_278.prec_elem = 0x1c;
              local_278.neg = false;
              local_278.exp = 0;
              pDVar23 = (DataKey *)&local_308;
              pcVar25 = &local_278;
              for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                (pcVar25->data)._M_elems[0] = pDVar23->info;
                pDVar23 = (DataKey *)&pDVar23[-(ulong)bVar32].idx;
                pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar32 * -8 + 4)
                ;
              }
              local_278.exp = local_308.exp;
              local_278.neg = local_308.neg;
              local_278.fpclass = local_308.fpclass;
              local_278.prec_elem = local_308.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        (&local_278,(cpp_dec_float<200U,_int,_void> *)local_1b0);
              if ((((fpclass_type)local_310 == cpp_dec_float_NaN) ||
                  (local_278.fpclass == cpp_dec_float_NaN)) ||
                 (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     ((cpp_dec_float<200U,_int,_void> *)local_388,&local_278),
                 iVar11 < 1)) {
                puVar22 = (undefined4 *)local_388;
                ppnVar20 = (pointer *)&local_130;
                for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                  *(undefined4 *)ppnVar20 = *puVar22;
                  puVar22 = puVar22 + (ulong)bVar32 * -2 + 1;
                  ppnVar20 = (pointer *)((long)ppnVar20 + (ulong)bVar32 * -8 + 4);
                }
                local_130.exp = iStack_318;
                local_130.neg = bStack_314;
                local_130.fpclass = (fpclass_type)local_310;
                local_130.prec_elem = local_310._4_4_;
                if ((fpclass_type)local_310 != cpp_dec_float_finite ||
                    local_130.data._M_elems[0] != 0) {
                  local_130.neg = (bool)(bStack_314 ^ 1);
                }
                local_b0.fpclass = cpp_dec_float_finite;
                local_b0.prec_elem = 0x1c;
                local_b0.neg = false;
                local_b0.exp = 0;
                pDVar23 = (DataKey *)&local_308;
                pcVar25 = &local_b0;
                for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                  (pcVar25->data)._M_elems[0] = pDVar23->info;
                  pDVar23 = (DataKey *)&pDVar23[-(ulong)bVar32].idx;
                  pcVar25 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar25 + (ulong)bVar32 * -8 + 4);
                }
                local_b0.exp = local_308.exp;
                local_b0.neg = local_308.neg;
                local_b0.fpclass = local_308.fpclass;
                local_b0.prec_elem = local_308.prec_elem;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                          (&local_b0,(cpp_dec_float<200U,_int,_void> *)local_1b0);
                if (((local_130.fpclass == cpp_dec_float_NaN) ||
                    (local_b0.fpclass == cpp_dec_float_NaN)) ||
                   (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                             compare(&local_130,&local_b0), iVar11 < 1)) goto LAB_0059f2ce;
              }
              (this->forbidden).data[iVar16] = 1;
              local_3e0 = (ulong)((int)local_3e0 - 1);
            }
LAB_0059f2ce:
            lVar27 = lVar27 + -1;
            lVar13 = lVar13 + -0x84;
          } while (1 < lVar27);
        }
        iVar16 = local_3ac;
        bVar31 = true;
        uVar12 = (int)local_3e0 - 1;
        local_3e0 = (ulong)uVar12;
        if (uVar12 == 0) {
          if (base->theRep == COLUMN) {
            while ((uVar29 = uVar29 + iVar16, -1 < (int)uVar29 && ((int)uVar29 < iVar17))) {
              setPrimalStatus(this,&local_1f0,base,local_3c0 + uVar29);
            }
            iVar11 = local_398->thesize;
            if ((long)iVar11 < 1) {
LAB_0059f42a:
              uVar29 = iVar11 - 1;
            }
            else {
              uVar29 = iVar11 - 1;
              lVar13 = (long)iVar11;
              do {
                if ((this->forbidden).data[lVar13 + -1] < 2) {
                  local_388 = (undefined1  [8])
                              SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::coId(base,uVar29);
                  setDualStatus<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_1f0,base,(SPxId *)local_388);
                }
                uVar29 = uVar29 - 1;
                lVar27 = lVar13 + -1;
                bVar31 = 0 < lVar13;
                lVar13 = lVar27;
              } while (lVar27 != 0 && bVar31);
            }
          }
          else {
            while ((uVar29 = uVar29 + iVar16, -1 < (int)uVar29 && ((int)uVar29 < iVar17))) {
              setDualStatus<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_1f0,base,local_3c0 + uVar29);
            }
            iVar11 = local_398->thesize;
            if ((long)iVar11 < 1) goto LAB_0059f42a;
            uVar29 = iVar11 - 1;
            lVar13 = (long)iVar11;
            do {
              if ((this->forbidden).data[lVar13 + -1] < 2) {
                local_388 = (undefined1  [8])
                            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::coId(base,uVar29);
                setPrimalStatus(this,&local_1f0,base,(SPxId *)local_388);
              }
              uVar29 = uVar29 - 1;
              lVar27 = lVar13 + -1;
              bVar31 = 0 < lVar13;
              lVar13 = lVar27;
            } while (lVar27 != 0 && bVar31);
          }
          local_3e0 = 0;
          bVar31 = false;
        }
      }
      if (!bVar31) break;
      uVar29 = uVar29 + iVar16;
      uVar15 = (ulong)uVar29;
      if (((int)uVar29 < 0) || (iVar17 <= (int)uVar29)) break;
    } while( true );
  }
  (*(base->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x58])(base,&local_1f0);
  if (local_3c0 != (SPxId *)0x0) {
    free(local_3c0);
    local_3c0 = (SPxId *)0x0;
  }
  if (local_1f0.colstat.data != (Status *)0x0) {
    free(local_1f0.colstat.data);
    local_1f0.colstat.data = (Status *)0x0;
  }
  if (local_1f0.rowstat.data != (Status *)0x0) {
    free(local_1f0.rowstat.data);
  }
  return;
}

Assistant:

void SPxWeightST<R>::generate(SPxSolverBase<R>& base)
{
   SPxId tmpId;

   forbidden.reSize(base.dim());
   rowWeight.reSize(base.nRows());
   colWeight.reSize(base.nCols());
   rowRight.reSize(base.nRows());
   colUp.reSize(base.nCols());

   if(base.rep() == SPxSolverBase<R>::COLUMN)
   {
      weight   = &colWeight;
      coWeight = &rowWeight;
   }
   else
   {
      weight   = &rowWeight;
      coWeight = &colWeight;
   }

   assert(weight->size()   == base.coDim());
   assert(coWeight->size() == base.dim());

   setupWeights(base);

   typename SPxBasisBase<R>::Desc desc(base);
   //   desc.reSize(base.nRows(), base.nCols());

   DataArray < SPxId > pref(base.nRows() + base.nCols());
   initPrefs(pref, base, rowWeight, colWeight);

   int i;
   int stepi;
   int j;
   int sel;

   for(i = 0; i < base.dim(); ++i)
      forbidden[i] = 0;

   if(base.rep() == SPxSolverBase<R>::COLUMN)
   {
      // in COLUMN rep we scan from beginning to end
      i      = 0;
      stepi = 1;
   }
   else
   {
      // in ROW rep we scan from end to beginning
      i      = pref.size() - 1;
      stepi = -1;
   }

   int  dim = base.dim();
   R maxEntry = 0;

   for(; i >= 0 && i < pref.size(); i += stepi)
   {
      tmpId              = pref[i];
      const SVectorBase<R>& vec = base.vector(tmpId);
      sel                = -1;

      // column or row singleton ?
      if(vec.size() == 1)
      {
         int idx = vec.index(0);

         if(forbidden[idx] < 2)
         {
            sel  = idx;
            dim += (forbidden[idx] > 0) ? 1 : 0;
         }
      }
      else
      {
         maxEntry = vec.maxAbs();

         // initialize the nonzero counter
         int minRowEntries = base.nRows();

         // find a stable index with a sparse row/column
         for(j = vec.size(); --j >= 0;)
         {
            R x = vec.value(j);
            int  k = vec.index(j);
            int  nRowEntries = base.coVector(k).size();

            if(!forbidden[k]
                  && (spxAbs(x) > this->tolerances()->scaleAccordingToEpsilon(SOPLEX_STABLE) * maxEntry)
                  && (nRowEntries < minRowEntries))
            {
               minRowEntries = nRowEntries;
               sel  = k;
            }
         }
      }

      // we found a valid index
      if(sel >= 0)
      {
         SPX_DEBUG(

            if(pref[i].type() == SPxId::ROW_ID)
            std::cout << "DWEIST01 r" << base.number(pref[i]);
            else
               std::cout << "DWEIST02 c" << base.number(pref[i]);
            )

               forbidden[sel] = 2;

         // put current column/row into basis
         if(base.rep() == SPxSolverBase<R>::COLUMN)
            setDualStatus(desc, base, pref[i]);
         else
            setPrimalStatus(desc, base, pref[i]);

         for(j = vec.size(); --j >= 0;)
         {
            R x = vec.value(j);
            int  k = vec.index(j);
            R feastol = this->tolerances()->floatingPointFeastol();

            if(!forbidden[k] && (x > feastol * maxEntry || -x > feastol * maxEntry))
            {
               forbidden[k] = 1;
               --dim;
            }
         }

         if(--dim == 0)
         {
            //@ for(++i; i < pref.size(); ++i)
            if(base.rep() == SPxSolverBase<R>::COLUMN)
            {
               // set all remaining indeces to nonbasic status
               for(i += stepi; i >= 0 && i < pref.size(); i += stepi)
                  setPrimalStatus(desc, base, pref[i]);

               // fill up the basis wherever linear independence is assured
               for(i = forbidden.size(); --i >= 0;)
               {
                  if(forbidden[i] < 2)
                     setDualStatus(desc, base, base.coId(i));
               }
            }
            else
            {
               for(i += stepi; i >= 0 && i < pref.size(); i += stepi)
                  setDualStatus(desc, base, pref[i]);

               for(i = forbidden.size(); --i >= 0;)
               {
                  if(forbidden[i] < 2)
                     setPrimalStatus(desc, base, base.coId(i));
               }
            }

            break;
         }
      }
      // sel == -1
      else if(base.rep() == SPxSolverBase<R>::COLUMN)
         setPrimalStatus(desc, base, pref[i]);
      else
         setDualStatus(desc, base, pref[i]);

#ifndef NDEBUG
      {
         int n, m;

         for(n = 0, m = forbidden.size(); n < forbidden.size(); ++n)
            m -= (forbidden[n] != 0) ? 1 : 0;

         assert(m == dim);
      }
#endif  // NDEBUG
   }

   assert(dim == 0);

   base.loadBasis(desc);
#ifdef  TEST
   base.init();

   int changed = 0;
   const VectorBase<R>& pvec = base.pVec();

   for(i = pvec.dim() - 1; i >= 0; --i)
   {
      if(desc.colStatus(i) == SPxBasisBase<R>::Desc::P_ON_UPPER
            && base.lower(i) > R(-infinity) && pvec[i] > base.maxObj(i))
      {
         changed = 1;
         desc.colStatus(i) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      }
      else if(desc.colStatus(i) == SPxBasisBase<R>::Desc::P_ON_LOWER
              && base.upper(i) < R(infinity) && pvec[i] < base.maxObj(i))
      {
         changed = 1;
         desc.colStatus(i) = SPxBasisBase<R>::Desc::P_ON_UPPER;
      }
   }

   if(changed)
   {
      std::cout << "changed basis\n";
      base.loadBasis(desc);
   }
   else
      std::cout << "nothing changed\n";

#endif  // TEST
}